

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_titlecase_brkiter.cpp
# Opt level: O0

int32_t ucasemap_toTitle_63(UCaseMap *csm,UChar *dest,int32_t destCapacity,UChar *src,
                           int32_t srcLength,UErrorCode *pErrorCode)

{
  UBool UVar1;
  BreakIterator *pBVar2;
  BreakIterator *pBVar3;
  ConstChar16Ptr local_a8;
  undefined1 local_a0 [8];
  UnicodeString s;
  BreakIterator *iter;
  LocalPointer<icu_63::BreakIterator> ownedIter;
  UErrorCode *pErrorCode_local;
  int32_t srcLength_local;
  UChar *src_local;
  int32_t destCapacity_local;
  UChar *dest_local;
  UCaseMap *csm_local;
  
  ownedIter.super_LocalPointerBase<icu_63::BreakIterator>.ptr =
       (LocalPointerBase<icu_63::BreakIterator>)(LocalPointerBase<icu_63::BreakIterator>)pErrorCode;
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if (*(long *)csm == 0) {
      icu_63::LocalPointer<icu_63::BreakIterator>::LocalPointer
                ((LocalPointer<icu_63::BreakIterator> *)&iter,(BreakIterator *)0x0);
      pBVar2 = ustrcase_getTitleBreakIterator_63
                         ((Locale *)0x0,(char *)(csm + 8),*(uint32_t *)(csm + 0x2c),
                          (BreakIterator *)0x0,(LocalPointer<icu_63::BreakIterator> *)&iter,
                          (UErrorCode *)ownedIter.super_LocalPointerBase<icu_63::BreakIterator>.ptr)
      ;
      if (pBVar2 != (BreakIterator *)0x0) {
        pBVar3 = icu_63::LocalPointerBase<icu_63::BreakIterator>::orphan
                           ((LocalPointerBase<icu_63::BreakIterator> *)&iter);
        *(BreakIterator **)csm = pBVar3;
      }
      else {
        csm_local._4_4_ = 0;
      }
      s.fUnion._49_3_ = 0;
      s.fUnion.fStackFields.fBuffer[0x17]._0_1_ = pBVar2 == (BreakIterator *)0x0;
      icu_63::LocalPointer<icu_63::BreakIterator>::~LocalPointer
                ((LocalPointer<icu_63::BreakIterator> *)&iter);
      if (s.fUnion._48_4_ != 0) {
        return csm_local._4_4_;
      }
    }
    icu_63::ConstChar16Ptr::ConstChar16Ptr(&local_a8,src);
    icu_63::UnicodeString::UnicodeString
              ((UnicodeString *)local_a0,(byte)((uint)srcLength >> 0x1f),&local_a8,srcLength);
    icu_63::ConstChar16Ptr::~ConstChar16Ptr(&local_a8);
    (**(code **)(**(long **)csm + 0x38))(*(long **)csm,local_a0);
    csm_local._4_4_ =
         ustrcase_map_63(*(int32_t *)(csm + 0x28),*(uint32_t *)(csm + 0x2c),*(BreakIterator **)csm,
                         dest,destCapacity,src,srcLength,ustrcase_internalToTitle_63,(Edits *)0x0,
                         (UErrorCode *)ownedIter.super_LocalPointerBase<icu_63::BreakIterator>.ptr);
    s.fUnion._48_4_ = 1;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_a0);
  }
  else {
    csm_local._4_4_ = 0;
  }
  return csm_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucasemap_toTitle(UCaseMap *csm,
                 UChar *dest, int32_t destCapacity,
                 const UChar *src, int32_t srcLength,
                 UErrorCode *pErrorCode) {
    if (U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if (csm->iter == NULL) {
        LocalPointer<BreakIterator> ownedIter;
        BreakIterator *iter = ustrcase_getTitleBreakIterator(
            nullptr, csm->locale, csm->options, nullptr, ownedIter, *pErrorCode);
        if (iter == nullptr) {
            return 0;
        }
        csm->iter = ownedIter.orphan();
    }
    UnicodeString s(srcLength<0, src, srcLength);
    csm->iter->setText(s);
    return ustrcase_map(
        csm->caseLocale, csm->options, csm->iter,
        dest, destCapacity,
        src, srcLength,
        ustrcase_internalToTitle, NULL, *pErrorCode);
}